

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O0

void sysbvm_byteStream_nextPut(sysbvm_context_t *context,sysbvm_tuple_t byteStream,uint8_t value)

{
  _Bool _Var1;
  sysbvm_size_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_object_tuple_t *storage;
  size_t requiredCapacity;
  size_t capacity;
  size_t size;
  sysbvm_byteStream_t *byteStreamObject;
  uint8_t value_local;
  sysbvm_tuple_t byteStream_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(byteStream);
  if (_Var1) {
    sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(byteStream + 0x10));
    sVar3 = sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(byteStream + 0x18));
    if (sVar3 < sVar2 + 1) {
      sysbvm_byteStream_increaseCapacityToAtLeast(context,byteStream,sVar2 + 1);
    }
    *(uint8_t *)(*(long *)(byteStream + 0x18) + 0x10 + sVar2) = value;
    sVar4 = sysbvm_tuple_size_encode(context,sVar2 + 1);
    *(sysbvm_tuple_t *)(byteStream + 0x10) = sVar4;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_byteStream_nextPut(sysbvm_context_t *context, sysbvm_tuple_t byteStream, uint8_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(byteStream))
        return;

    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    size_t capacity = sysbvm_tuple_getSizeInBytes(byteStreamObject->storage);
    size_t requiredCapacity = size + 1;
    if(requiredCapacity > capacity)
        sysbvm_byteStream_increaseCapacityToAtLeast(context, byteStream, requiredCapacity);

    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    storage->bytes[size] = value;
    byteStreamObject->size = sysbvm_tuple_size_encode(context, size + 1);

}